

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O1

bool __thiscall Assimp::ASE::Parser::ParseString(Parser *this,string *out,char *szName)

{
  ulong uVar1;
  char *__format;
  byte *pbVar2;
  byte *pbVar3;
  char szBuffer [1024];
  long *local_438 [2];
  long local_428 [127];
  
  for (pbVar2 = (byte *)this->filePtr; (*pbVar2 == 0x20 || (*pbVar2 == 9)); pbVar2 = pbVar2 + 1) {
  }
  this->filePtr = (char *)pbVar2;
  uVar1 = (ulong)*pbVar2;
  if (uVar1 < 0x23) {
    if ((0x3401UL >> (uVar1 & 0x3f) & 1) != 0) {
      __format = "Unable to parse %s block: Unexpected EOL";
      goto LAB_0041045f;
    }
    if (uVar1 == 0x22) {
      pbVar2 = pbVar2 + 1;
      this->filePtr = (char *)pbVar2;
      pbVar3 = pbVar2;
      while( true ) {
        if (*pbVar3 == 0x22) {
          local_438[0] = local_428;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_438,pbVar2,pbVar3,szName);
          std::__cxx11::string::operator=((string *)out,(string *)local_438);
          if (local_438[0] != local_428) {
            operator_delete(local_438[0],local_428[0] + 1);
          }
          this->filePtr = (char *)(pbVar3 + 1);
          return true;
        }
        if (*pbVar3 == 0) break;
        pbVar3 = pbVar3 + 1;
      }
      __format = 
      "Unable to parse %s block: Strings are expected to be enclosed in double quotation marks but EOF was reached before a closing quotation mark was encountered"
      ;
      goto LAB_0041045f;
    }
  }
  __format = 
  "Unable to parse %s block: Strings are expected to be enclosed in double quotation marks";
LAB_0041045f:
  snprintf((char *)local_438,0x400,__format);
  LogWarning(this,(char *)local_438);
  return false;
}

Assistant:

bool Parser::ParseString(std::string& out,const char* szName)
{
    char szBuffer[1024];
    if (!SkipSpaces(&filePtr))
    {

        ai_snprintf(szBuffer, 1024, "Unable to parse %s block: Unexpected EOL",szName);
        LogWarning(szBuffer);
        return false;
    }
    // there must be '"'
    if ('\"' != *filePtr)
    {

        ai_snprintf(szBuffer, 1024, "Unable to parse %s block: Strings are expected "
            "to be enclosed in double quotation marks",szName);
        LogWarning(szBuffer);
        return false;
    }
    ++filePtr;
    const char* sz = filePtr;
    while (true)
    {
        if ('\"' == *sz)break;
        else if ('\0' == *sz)
        {
            ai_snprintf(szBuffer, 1024, "Unable to parse %s block: Strings are expected to "
                "be enclosed in double quotation marks but EOF was reached before "
                "a closing quotation mark was encountered",szName);
            LogWarning(szBuffer);
            return false;
        }
        sz++;
    }
    out = std::string(filePtr,(uintptr_t)sz-(uintptr_t)filePtr);
    filePtr = sz+1;
    return true;
}